

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2_gmv.c
# Opt level: O3

void iep2_update_gmv(iep2_api_ctx *ctx,mv_list *mv_ls)

{
  iep2_output *__src;
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 uVar3;
  RK_U32 RVar4;
  void *__dest;
  ulong uVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int map [56];
  
  uVar1 = (ctx->params).tile_cols;
  uVar2 = (ctx->params).tile_rows;
  __src = &ctx->output;
  lVar8 = 0;
  do {
    if ((__src->mv_hist[lVar8] != 0) && ((iep_debug & 2) != 0)) {
      _mpp_log_l(4,"iep2","iep:mv(%d) %d\n",(char *)0x0,(ulong)((int)lVar8 - 0x1c));
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x38);
  (ctx->output).mv_hist[0x1c] = 0;
  __dest = malloc(0xe0);
  memcpy(__dest,__src,0xe0);
  iVar15 = 0;
  iVar16 = 1;
  iVar17 = 2;
  iVar18 = 3;
  lVar8 = 0;
  do {
    map[lVar8] = iVar15;
    map[lVar8 + 1] = iVar16;
    map[lVar8 + 2] = iVar17;
    map[lVar8 + 3] = iVar18;
    lVar8 = lVar8 + 4;
    iVar15 = iVar15 + 4;
    iVar16 = iVar16 + 4;
    iVar17 = iVar17 + 4;
    iVar18 = iVar18 + 4;
  } while (lVar8 != 0x38);
  uVar5 = 1;
  uVar14 = 0;
  do {
    if (uVar14 < 0x37) {
      uVar7 = uVar5;
      uVar10 = uVar14 & 0xffffffff;
      do {
        uVar9 = uVar7 & 0xffffffff;
        if (*(uint *)((long)__dest + uVar7 * 4) <= *(uint *)((long)__dest + (long)(int)uVar10 * 4))
        {
          uVar9 = uVar10;
        }
        uVar7 = uVar7 + 1;
        iVar15 = (int)uVar9;
        uVar10 = uVar9;
      } while (uVar7 != 0x38);
    }
    else {
      iVar15 = (int)uVar14;
    }
    uVar3 = *(undefined4 *)((long)__dest + uVar14 * 4);
    iVar16 = map[uVar14];
    lVar8 = (long)iVar15;
    map[uVar14] = map[lVar8];
    *(undefined4 *)((long)__dest + uVar14 * 4) = *(undefined4 *)((long)__dest + lVar8 * 4);
    uVar14 = uVar14 + 1;
    map[lVar8] = iVar16;
    *(undefined4 *)((long)__dest + lVar8 * 4) = uVar3;
    uVar5 = uVar5 + 1;
  } while (uVar14 != 0x38);
  free(__dest);
  if ((iep_debug & 2) != 0) {
    _mpp_log_l(4,"iep2","iep:sort map:\n",(char *)0x0);
  }
  (ctx->params).mv_tru_vld[2] = 0;
  (ctx->params).mv_tru_vld[3] = 0;
  (ctx->params).mv_tru_vld[4] = 0;
  (ctx->params).mv_tru_vld[5] = 0;
  (ctx->params).mv_tru_list[0] = '\0';
  (ctx->params).mv_tru_list[1] = '\0';
  (ctx->params).mv_tru_list[2] = '\0';
  (ctx->params).mv_tru_list[3] = '\0';
  (ctx->params).mv_tru_list[4] = '\0';
  (ctx->params).mv_tru_list[5] = '\0';
  (ctx->params).mv_tru_list[6] = '\0';
  (ctx->params).mv_tru_list[7] = '\0';
  (ctx->params).mv_tru_vld[0] = 0;
  (ctx->params).mv_tru_vld[1] = 0;
  (ctx->params).mv_tru_vld[6] = 0;
  (ctx->params).mv_tru_vld[7] = 0;
  lVar8 = 0;
  do {
    cVar6 = (char)map[lVar8] + -0x1c;
    if (__src->mv_hist[map[lVar8]] <= (uint)(((int)(uVar1 * uVar2) >> 7) * 6)) {
      if ((long)mv_ls->idx < 1) {
LAB_0017e422:
        if ((int)lVar8 == 0) {
          (ctx->params).mv_tru_list[0] = '\0';
          (ctx->params).mv_tru_vld[0] = 1;
        }
        break;
      }
      lVar11 = 0;
      while( true ) {
        uVar12 = mv_ls->mv[lVar11] + cVar6 * -4;
        uVar13 = -uVar12;
        if (0 < (int)uVar12) {
          uVar13 = uVar12;
        }
        if (uVar13 < 3) break;
        lVar11 = lVar11 + 1;
        if (mv_ls->idx == lVar11) goto LAB_0017e422;
      }
    }
    (ctx->params).mv_tru_list[lVar8] = cVar6;
    (ctx->params).mv_tru_vld[lVar8] = 1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  uVar14 = 0;
  RVar4 = iep_debug;
  do {
    if ((RVar4 & 2) != 0) {
      _mpp_log_l(4,"iep2","iep:new mv candidates list[%d] (%d,%d) %d\n",(char *)0x0,
                 uVar14 & 0xffffffff,(ulong)(uint)(int)(ctx->params).mv_tru_list[uVar14],0,
                 (ulong)(ctx->params).mv_tru_vld[uVar14]);
      RVar4 = iep_debug;
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 8);
  return;
}

Assistant:

void iep2_update_gmv(struct iep2_api_ctx *ctx, struct mv_list *mv_ls)
{
    int rows = ctx->params.tile_rows;
    int cols = ctx->params.tile_cols;
    uint32_t *bin = ctx->output.mv_hist;
    int lbin = MPP_ARRAY_ELEMS(ctx->output.mv_hist);
    int i;

    int map[MPP_ARRAY_ELEMS(ctx->output.mv_hist)];

    uint32_t r = 6;

    // print mvc histogram of current motion estimation.
    for (i = 0; i < lbin; ++i) {
        if (bin[i] == 0)
            continue;
        iep_dbg_trace("mv(%d) %d\n", i - MVL, bin[i]);
    }

    bin[MVL] = 0; // disable 0 mv

    // update motion vector candidates
    iep2_sort(bin, map, lbin);

    iep_dbg_trace("sort map:\n");
    if (0) {
        for (i = 0; i < lbin; ++i) {
            fprintf(stderr, "%d ", map[i]);
        }
        fprintf(stderr, "\n");
    }

    memset(ctx->params.mv_tru_list, 0, sizeof(ctx->params.mv_tru_list));
    memset(ctx->params.mv_tru_vld, 0, sizeof(ctx->params.mv_tru_vld));

    // Get top 8 candidates of current motion estimation.
    for (i = 0; i < 8; ++i) {
        int8_t x = map[i] - MVL;

        if (bin[map[i]] > r * ((rows * cols) >> 7) ||
            iep2_is_subt_mv(x, mv_ls)) {

            // 1 bit at low endian for mv valid check
            ctx->params.mv_tru_list[i] = x;
            ctx->params.mv_tru_vld[i] = 1;
        } else {
            if (i == 0) {
                ctx->params.mv_tru_list[0] = 0;
                ctx->params.mv_tru_vld[0] = 1;
            }
            break;
        }
    }

    for (i = 0; i < 8; ++i)
        iep_dbg_trace("new mv candidates list[%d] (%d,%d) %d\n",
                      i, ctx->params.mv_tru_list[i], 0, ctx->params.mv_tru_vld[i]);
}